

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildNameCommand.cxx
# Opt level: O1

bool __thiscall
cmBuildNameCommand::InitialPass
          (cmBuildNameCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  cmMakefile *this_00;
  bool bVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  long *plVar5;
  size_type *psVar6;
  bool bVar7;
  string buildname;
  string RegExp;
  string compiler;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  string local_160;
  string local_140;
  undefined1 local_120 [184];
  char *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar1 = cmCommand::Disallowed
                    (&this->super_cmCommand,CMP0036,
                     "The build_name command should not be called; see CMP0036.");
  bVar7 = true;
  if (!bVar1) {
    name = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish == name) {
      local_120._0_8_ = local_120 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_120,"called with incorrect number of arguments","");
      cmCommand::SetError(&this->super_cmCommand,(string *)local_120);
      if ((undefined1 *)local_120._0_8_ != local_120 + 0x10) {
        operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
      }
      bVar7 = false;
    }
    else {
      pcVar2 = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,name);
      if (pcVar2 == (char *)0x0) {
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c0,"WinNT","");
        this_00 = (this->super_cmCommand).Makefile;
        pcVar2 = local_120 + 0x10;
        local_120._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"UNIX","");
        pcVar4 = cmMakefile::GetDefinition(this_00,(string *)local_120);
        if ((char *)local_120._0_8_ != pcVar2) {
          operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
        }
        if (pcVar4 != (char *)0x0) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1c0,0,(char *)local_1c0._M_string_length,0x550243);
          cmSystemTools::RunSingleCommand
                    ("uname -a",&local_1c0,&local_1c0,(int *)0x0,(char *)0x0,OUTPUT_MERGE,0.0);
          if ((char *)local_1c0._M_string_length != (char *)0x0) {
            local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_1a0,"([^ ]*) [^ ]* ([^ ]*) ","");
            local_68 = (char *)0x0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              cmsys::RegularExpression::compile
                        ((RegularExpression *)local_120,local_1a0._M_dataplus._M_p);
            }
            bVar1 = cmsys::RegularExpression::find
                              ((RegularExpression *)local_120,local_1c0._M_dataplus._M_p);
            if (bVar1) {
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_140,(RegularExpression *)local_120,1);
              plVar5 = (long *)std::__cxx11::string::append((char *)&local_140);
              psVar6 = (size_type *)(plVar5 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar5 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar6) {
                local_180.field_2._M_allocated_capacity = *psVar6;
                local_180.field_2._8_8_ = plVar5[3];
                local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
              }
              else {
                local_180.field_2._M_allocated_capacity = *psVar6;
                local_180._M_dataplus._M_p = (pointer)*plVar5;
              }
              local_180._M_string_length = plVar5[1];
              *plVar5 = (long)psVar6;
              plVar5[1] = 0;
              *(undefined1 *)(plVar5 + 2) = 0;
              cmsys::RegularExpression::match_abi_cxx11_
                        (&local_160,(RegularExpression *)local_120,2);
              std::operator+(&local_50,&local_180,&local_160);
              std::__cxx11::string::operator=((string *)&local_1c0,(string *)&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_140._M_dataplus._M_p != &local_140.field_2) {
                operator_delete(local_140._M_dataplus._M_p,
                                local_140.field_2._M_allocated_capacity + 1);
              }
            }
            if (local_68 != (char *)0x0) {
              operator_delete__(local_68);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
              operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        local_120._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_120,"${CMAKE_CXX_COMPILER}","");
        cmMakefile::ExpandVariablesInString((this->super_cmCommand).Makefile,(string *)local_120);
        std::__cxx11::string::append((char *)&local_1c0);
        cmsys::SystemTools::GetFilenameName(&local_1a0,(string *)local_120);
        std::__cxx11::string::_M_append((char *)&local_1c0,(ulong)local_1a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        cmsys::SystemTools::ReplaceString(&local_1c0,"/","_");
        cmsys::SystemTools::ReplaceString(&local_1c0,"(","_");
        cmsys::SystemTools::ReplaceString(&local_1c0,")","_");
        cmMakefile::AddCacheDefinition
                  ((this->super_cmCommand).Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
                   "Name of build.",STRING,false);
        if ((char *)local_120._0_8_ != pcVar2) {
          operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        local_68 = (char *)0x0;
        cmsys::RegularExpression::compile((RegularExpression *)local_120,"[()/]");
        bVar1 = cmsys::RegularExpression::find((RegularExpression *)local_120,pcVar2);
        if (bVar1) {
          local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
          sVar3 = strlen(pcVar2);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1c0,pcVar2,pcVar2 + sVar3);
          cmsys::SystemTools::ReplaceString(&local_1c0,"/","_");
          cmsys::SystemTools::ReplaceString(&local_1c0,"(","_");
          cmsys::SystemTools::ReplaceString(&local_1c0,")","_");
          cmMakefile::AddCacheDefinition
                    ((this->super_cmCommand).Makefile,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,local_1c0._M_dataplus._M_p,
                     "Name of build.",STRING,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
            operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
          }
        }
        if (local_68 != (char *)0x0) {
          operator_delete__(local_68);
        }
      }
    }
  }
  return bVar7;
}

Assistant:

bool cmBuildNameCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(this->Disallowed(cmPolicies::CMP0036,
      "The build_name command should not be called; see CMP0036."))
    { return true; }
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }
  const char* cacheValue = this->Makefile->GetDefinition(args[0]);
  if(cacheValue)
    {
    // do we need to correct the value?
    cmsys::RegularExpression reg("[()/]");
    if (reg.find(cacheValue))
      {
      std::string cv = cacheValue;
      cmSystemTools::ReplaceString(cv,"/", "_");
      cmSystemTools::ReplaceString(cv,"(", "_");
      cmSystemTools::ReplaceString(cv,")", "_");
      this->Makefile->AddCacheDefinition(args[0],
                                     cv.c_str(),
                                     "Name of build.",
                                     cmState::STRING);
      }
    return true;
    }


  std::string buildname = "WinNT";
  if(this->Makefile->GetDefinition("UNIX"))
    {
    buildname = "";
    cmSystemTools::RunSingleCommand("uname -a", &buildname, &buildname);
    if(!buildname.empty())
      {
      std::string RegExp = "([^ ]*) [^ ]* ([^ ]*) ";
      cmsys::RegularExpression reg( RegExp.c_str() );
      if(reg.find(buildname.c_str()))
        {
        buildname = reg.match(1) + "-" + reg.match(2);
        }
      }
    }
  std::string compiler = "${CMAKE_CXX_COMPILER}";
  this->Makefile->ExpandVariablesInString ( compiler );
  buildname += "-";
  buildname += cmSystemTools::GetFilenameName(compiler);
  cmSystemTools::ReplaceString(buildname,
                               "/", "_");
  cmSystemTools::ReplaceString(buildname,
                               "(", "_");
  cmSystemTools::ReplaceString(buildname,
                               ")", "_");

  this->Makefile->AddCacheDefinition(args[0],
                                 buildname.c_str(),
                                 "Name of build.",
                                 cmState::STRING);
  return true;
}